

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

VkResult Fossilize::CreatePipelineLayout
                   (VkDevice device,VkPipelineLayoutCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pAllocator,VkPipelineLayout *pLayout)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *this;
  VkLayerDispatchTable *pVVar4;
  StateRecorder *this_00;
  VkResult result;
  Device *layer;
  VkPipelineLayout *pLayout_local;
  VkAllocationCallbacks *pAllocator_local;
  VkPipelineLayoutCreateInfo *pCreateInfo_local;
  VkDevice device_local;
  
  this = get_device_layer(device);
  pVVar4 = Device::getTable(this);
  VVar2 = (*pVVar4->CreatePipelineLayout)(device,pCreateInfo,pAllocator,pLayout);
  if (VVar2 == VK_SUCCESS) {
    this_00 = Device::getRecorder(this);
    bVar1 = StateRecorder::record_pipeline_layout(this_00,*pLayout,pCreateInfo,0);
    if (((!bVar1) && (LVar3 = get_thread_log_level(), (int)LVar3 < 2)) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record pipeline layout, usually caused by unsupported pNext.\n"
                          ), !bVar1)) {
      fprintf(_stderr,
              "Fossilize WARN: Failed to record pipeline layout, usually caused by unsupported pNext.\n"
             );
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreatePipelineLayout(VkDevice device,
                                                           const VkPipelineLayoutCreateInfo *pCreateInfo,
                                                           const VkAllocationCallbacks *pAllocator,
                                                           VkPipelineLayout *pLayout)
{
	auto *layer = get_device_layer(device);

	VkResult result = layer->getTable()->CreatePipelineLayout(device, pCreateInfo, pAllocator, pLayout);

	if (result == VK_SUCCESS)
	{
		if (!layer->getRecorder().record_pipeline_layout(*pLayout, *pCreateInfo))
			LOGW_LEVEL("Failed to record pipeline layout, usually caused by unsupported pNext.\n");
	}
	return result;
}